

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O2

int arkInterpResize_Lagrange
              (void *arkode_mem,ARKInterp I,ARKVecResizeFn resize,void *resize_data,
              sunindextype lrw_diff,sunindextype liw_diff,N_Vector y0)

{
  int iVar1;
  long lVar2;
  long lVar3;
  void *pvVar4;
  
  if (arkode_mem == (void *)0x0) {
    iVar1 = -0x15;
  }
  else {
    iVar1 = 0;
    if (I != (ARKInterp)0x0) {
      pvVar4 = I->content;
      if (*(long *)((long)pvVar4 + 8) == 0) {
LAB_003b5ea7:
        iVar1 = 0;
        *(undefined4 *)((long)pvVar4 + 0x18) = 0;
      }
      else {
        lVar3 = -1;
        lVar2 = 0;
        do {
          pvVar4 = I->content;
          lVar3 = lVar3 + 1;
          if (*(int *)((long)pvVar4 + 4) <= lVar3) goto LAB_003b5ea7;
          iVar1 = arkResizeVec((ARKodeMem)arkode_mem,resize,resize_data,lrw_diff,liw_diff,y0,
                               (N_Vector *)(lVar2 + *(long *)((long)pvVar4 + 8)));
          lVar2 = lVar2 + 8;
        } while (iVar1 != 0);
        iVar1 = -0x14;
      }
    }
  }
  return iVar1;
}

Assistant:

int arkInterpResize_Lagrange(void* arkode_mem, ARKInterp I,
                             ARKVecResizeFn resize, void *resize_data,
                             sunindextype lrw_diff, sunindextype liw_diff,
                             N_Vector y0)
{
  int i;
  ARKodeMem ark_mem;

  /* access ARKodeMem structure */
  if (arkode_mem == NULL)  return(ARK_MEM_NULL);
  ark_mem = (ARKodeMem) arkode_mem;

  /* resize vectors */
  if (I == NULL)  return(ARK_SUCCESS);
  if (LINT_YHIST(I) != NULL) {
    for (i=0; i<LINT_NMAXALLOC(I); i++) {
      if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff,
                        liw_diff, y0, &(LINT_YJ(I,i))))
        return(ARK_MEM_FAIL);
    }
  }

  /* reset active history length */
  LINT_NHIST(I) = 0;

  return(ARK_SUCCESS);
}